

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmyblas2.c
# Opt level: O0

void cusolve(int ldm,int ncol,singlecomplex *M,singlecomplex *rhs)

{
  float fVar1;
  float fVar2;
  singlecomplex sVar3;
  float ci;
  float cr;
  int irow;
  int j;
  int jcol;
  singlecomplex temp;
  singlecomplex xj;
  singlecomplex *rhs_local;
  singlecomplex *M_local;
  int ncol_local;
  int ldm_local;
  
  irow = ncol + -1;
  for (cr = 0.0; (int)cr < ncol; cr = (float)((int)cr + 1)) {
    c_div(&temp,rhs + irow,M + (irow + irow * ldm));
    sVar3.i = temp.i;
    sVar3.r = temp.r;
    rhs[irow] = sVar3;
    for (ci = 0.0; (int)ci < irow; ci = (float)((int)ci + 1)) {
      fVar1 = M[(int)ci + irow * ldm].r;
      fVar2 = M[(int)ci + irow * ldm].i;
      rhs[(int)ci].r =
           rhs[(int)ci].r -
           (temp.r * M[(int)ci + irow * ldm].r + -(temp.i * M[(int)ci + irow * ldm].i));
      rhs[(int)ci].i = rhs[(int)ci].i - (temp.i * fVar1 + temp.r * fVar2);
    }
    irow = irow + -1;
  }
  return;
}

Assistant:

void cusolve (int ldm, int ncol, singlecomplex *M, singlecomplex *rhs)
{
    singlecomplex xj, temp;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	c_div(&xj, &rhs[jcol], &M[jcol + jcol*ldm]); /* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++) {
	    cc_mult(&temp, &xj, &M[irow+jcol*ldm]); /* M(irow, jcol) */
	    c_sub(&rhs[irow], &rhs[irow], &temp);
	}

	jcol--;

    }
}